

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::entered4(SPxSteepPR<double> *this,SPxId param_1,int n)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  UpdateVector<double> *pUVar6;
  pointer pdVar7;
  UpdateVector<double> *pUVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  SVSetBase<double> *pSVar12;
  Item *pIVar13;
  bool bVar14;
  int iVar15;
  Nonzero<double> *pNVar16;
  long lVar17;
  long in_FS_OFFSET;
  double dVar18;
  Real RVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  if ((-1 < n) &&
     (pSVar4 = (this->super_SPxPricer<double>).thesolver, n < (pSVar4->thecovectors->set).thenum)) {
    dVar23 = 1.0 / (double)(pSVar4->super_SPxBasisBase<double>).iterCount + 2.0;
    pdVar5 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pUVar6 = pSVar4->thePvec;
    pdVar7 = (pUVar6->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pUVar8 = pSVar4->theCoPvec;
    dVar21 = 1.0 / (pSVar4->theFvec->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)n];
    lVar17 = (long)(pUVar8->thedelta).super_IdxSet.num;
    if (0 < lVar17) {
      pdVar9 = (pSVar4->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->workVec).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar11 = (pUVar8->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      lVar17 = lVar17 + 1;
      do {
        iVar2 = (pUVar8->thedelta).super_IdxSet.idx[lVar17 + -2];
        dVar18 = pdVar11[iVar2] * dVar21;
        dVar22 = pdVar10[iVar2];
        dVar18 = (this->pi_p * dVar18 - (dVar22 + dVar22)) * dVar18 + pdVar9[iVar2];
        pdVar9[iVar2] = dVar18;
        dVar22 = dVar23;
        if (dVar18 < dVar23) {
LAB_0020dd47:
          pdVar9[iVar2] = dVar22;
        }
        else {
          ::soplex::infinity::__tls_init();
          if (dVar1 < dVar18) {
            RVar19 = Tolerances::epsilon((((this->super_SPxPricer<double>).thesolver)->
                                         super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            dVar22 = 1.0 / RVar19;
            goto LAB_0020dd47;
          }
        }
        lVar17 = lVar17 + -1;
      } while (1 < lVar17);
    }
    lVar17 = (long)(pUVar6->thedelta).super_IdxSet.num;
    if (0 < lVar17) {
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      do {
        iVar2 = (pUVar6->thedelta).super_IdxSet.idx[lVar17 + -1];
        pSVar12 = ((this->super_SPxPricer<double>).thesolver)->thevectors;
        pIVar13 = (pSVar12->set).theitem;
        iVar3 = (pSVar12->set).thekey[iVar2].idx;
        iVar15 = pIVar13[iVar3].data.super_SVectorBase<double>.memused;
        if (iVar15 < 1) {
          dVar22 = 0.0;
        }
        else {
          pNVar16 = pIVar13[iVar3].data.super_SVectorBase<double>.m_elem;
          iVar15 = iVar15 + 1;
          dVar18 = 0.0;
          dVar22 = 0.0;
          do {
            dVar24 = pNVar16->val *
                     (this->workVec).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[pNVar16->idx];
            dVar20 = dVar22 + dVar24;
            dVar18 = dVar18 + (dVar24 - (dVar20 - dVar22)) + (dVar22 - (dVar20 - (dVar20 - dVar22)))
            ;
            pNVar16 = pNVar16 + 1;
            iVar15 = iVar15 + -1;
            dVar22 = dVar20;
          } while (1 < iVar15);
          dVar22 = dVar20 + dVar18 + dVar20 + dVar18;
        }
        dVar18 = pdVar7[iVar2] * dVar21;
        dVar18 = (this->pi_p * dVar18 - dVar22) * dVar18 + pdVar5[iVar2];
        pdVar5[iVar2] = dVar18;
        dVar22 = dVar23;
        if (dVar18 < dVar23) {
LAB_0020de8a:
          pdVar5[iVar2] = dVar22;
        }
        else {
          ::soplex::infinity::__tls_init();
          if (dVar1 < dVar18) {
            RVar19 = Tolerances::epsilon((((this->super_SPxPricer<double>).thesolver)->
                                         super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            dVar22 = 1.0 / RVar19;
            goto LAB_0020de8a;
          }
        }
        bVar14 = 1 < lVar17;
        lVar17 = lVar17 + -1;
      } while (bVar14);
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}